

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTest.cpp
# Opt level: O3

void __thiscall ParseErrorHandler::warning(ParseErrorHandler *this,SAXParseException *e)

{
  FILE *__stream;
  wchar16 *pwVar1;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  SAXParseException *this_00;
  char *message;
  char *systemId;
  char *local_40;
  char *local_38;
  
  pwVar1 = (wchar16 *)xercesc_4_0::SAXParseException::getSystemId();
  pcVar2 = (char *)xercesc_4_0::XMLString::transcode
                             (pwVar1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_38 = pcVar2;
  pwVar1 = (wchar16 *)(**(code **)(*(long *)e + 0x10))(e);
  pcVar3 = (char *)xercesc_4_0::XMLString::transcode
                             (pwVar1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  __stream = _stderr;
  local_40 = pcVar3;
  uVar4 = xercesc_4_0::SAXParseException::getLineNumber();
  uVar5 = xercesc_4_0::SAXParseException::getColumnNumber();
  fprintf(__stream,"\nWarning at file \"%s\", line %llu, char %llu:  %s\n",pcVar2,uVar4,uVar5,pcVar3
         );
  xercesc_4_0::XMLString::release(&local_38,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&local_40,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  this_00 = (SAXParseException *)__cxa_allocate_exception(0x38);
  xercesc_4_0::SAXParseException::SAXParseException(this_00,e);
  __cxa_throw(this_00,&xercesc_4_0::SAXParseException::typeinfo,
              xercesc_4_0::SAXParseException::~SAXParseException);
}

Assistant:

void ParseErrorHandler::warning(const SAXParseException& e)
{
    char* systemId = XMLString::transcode(e.getSystemId());
    char* message = XMLString::transcode(e.getMessage());

    fprintf(stderr, "\nWarning at file \"%s\", line %llu, char %llu:  %s\n",
            systemId, (unsigned long long) e.getLineNumber(),
            (unsigned long long) e.getColumnNumber(), message);

    XMLString::release(&systemId);
    XMLString::release(&message);
    throw e;

}